

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vacuum.cpp
# Opt level: O1

void __thiscall wasm::Vacuum::visitIf(Vacuum *this,If *curr)

{
  Id IVar1;
  Expression *right;
  bool bVar2;
  int64_t iVar3;
  Expression **ppEVar4;
  Block *this_00;
  Unary *this_01;
  Drop *this_02;
  Nop *output;
  Expression *pEVar5;
  Expression *pEVar6;
  optional<wasm::Type> type;
  Builder local_58;
  Builder builder;
  anon_class_16_2_3fdeafed optimizeArm;
  If *curr_local;
  
  if (curr->condition->_id == ConstId) {
    iVar3 = Literal::getInteger((Literal *)(curr->condition + 1));
    if (iVar3 == 0) {
      pEVar6 = curr->ifFalse;
      if (pEVar6 == (Expression *)0x0) {
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = NopId;
        (curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
        return;
      }
    }
    else {
      pEVar6 = curr->ifTrue;
    }
    Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
              ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
               &(this->
                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
               pEVar6);
    ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                        (&(this->
                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                          ).
                          super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                          .expressionStack);
    *ppEVar4 = pEVar6;
  }
  else {
    pEVar6 = curr->condition;
    if ((pEVar6->type).id == 1) {
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                 &(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 pEVar6);
      ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                          (&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                            .expressionStack);
      *ppEVar4 = pEVar6;
    }
    else {
      if (((((this->
             super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
             ).super_Pass.runner)->options).trapsNeverHappen == true) &&
         ((curr->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id != 1))
      {
        pEVar5 = curr->ifTrue;
        builder.wasm = (Module *)this;
        if (pEVar5->_id == UnreachableId) {
          right = curr->ifFalse;
          local_58.wasm =
               (this->
               super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
               ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
               super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
          this_00 = (Block *)MixedArena::allocSpace(&(local_58.wasm)->allocator,0x18,8);
          (((SpecificExpression<(wasm::Expression::Id)18> *)
           &this_00->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression)._id =
               DropId;
          (((SpecificExpression<(wasm::Expression::Id)18> *)
           &this_00->super_SpecificExpression<(wasm::Expression::Id)1>)->super_Expression).type.id =
               0;
          (this_00->name).super_IString.str._M_len = (size_t)pEVar6;
          Drop::finalize((Drop *)this_00);
          if (right != (Expression *)0x0) {
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._8_8_ = 0;
            type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pEVar5
            ;
            this_00 = Builder::makeSequence(&local_58,(Expression *)this_00,right,type);
          }
          Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                    ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                     &(this->
                      super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                      ).
                      super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                     (Expression *)this_00);
          ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                              (&(this->
                                super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                ).
                                super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                .expressionStack);
          *ppEVar4 = (Expression *)this_00;
          return;
        }
        if ((curr->ifFalse != (Expression *)0x0) &&
           (bVar2 = visitIf::anon_class_16_2_3fdeafed::operator()
                              ((anon_class_16_2_3fdeafed *)&builder,curr->ifFalse,curr->ifTrue),
           bVar2)) {
          return;
        }
      }
      pEVar6 = curr->ifFalse;
      if (pEVar6 == (Expression *)0x0) {
        if (curr->ifTrue->_id != NopId) {
          return;
        }
        pEVar6 = curr->condition;
        this_02 = (Drop *)MixedArena::allocSpace
                                    (&((this->
                                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                       ).
                                       super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                       .
                                       super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                       .
                                       super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                      .currModule)->allocator,0x18,8);
        (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
        (this_02->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
        this_02->value = pEVar6;
        Drop::finalize(this_02);
      }
      else {
        if (pEVar6->_id == NopId) {
          curr->ifFalse = (Expression *)0x0;
          return;
        }
        IVar1 = curr->ifTrue->_id;
        if (IVar1 != DropId) {
          if (IVar1 != NopId) {
            return;
          }
          curr->ifTrue = pEVar6;
          curr->ifFalse = (Expression *)0x0;
          pEVar6 = curr->condition;
          this_01 = (Unary *)MixedArena::allocSpace
                                       (&((this->
                                          super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                                          ).
                                          super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                          .
                                          super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                          .
                                          super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                                         .currModule)->allocator,0x20,8);
          (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id =
               UnaryId;
          (this_01->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0
          ;
          this_01->op = EqZInt32;
          this_01->value = pEVar6;
          Unary::finalize(this_01);
          curr->condition = (Expression *)this_01;
          return;
        }
        if (pEVar6->_id != DropId) {
          return;
        }
        pEVar5 = *(Expression **)(curr->ifTrue + 1);
        pEVar6 = *(Expression **)(pEVar6 + 1);
        if ((pEVar5->type).id != (pEVar6->type).id) {
          return;
        }
        curr->ifTrue = pEVar5;
        curr->ifFalse = pEVar6;
        If::finalize(curr,(optional<wasm::Type>)ZEXT116(0x12));
        builder.wasm = (this->
                       super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                       ).
                       super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                       .super_PostWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.
                       super_Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>.currModule;
        this_02 = Builder::makeDrop(&builder,(Expression *)curr);
      }
      Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>::replaceCurrent
                ((Walker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_> *)
                 &(this->
                  super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                  ).super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>,
                 (Expression *)this_02);
      ppEVar4 = SmallVector<wasm::Expression_*,_10UL>::back
                          (&(this->
                            super_WalkerPass<wasm::ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>_>
                            ).
                            super_ExpressionStackWalker<wasm::Vacuum,_wasm::Visitor<wasm::Vacuum,_void>_>
                            .expressionStack);
      *ppEVar4 = (Expression *)this_02;
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    // if the condition is a constant, just apply it
    // we can just return the ifTrue or ifFalse.
    if (auto* value = curr->condition->dynCast<Const>()) {
      Expression* child;
      if (value->value.getInteger()) {
        child = curr->ifTrue;
      } else {
        if (curr->ifFalse) {
          child = curr->ifFalse;
        } else {
          ExpressionManipulator::nop(curr);
          return;
        }
      }
      replaceCurrent(child);
      return;
    }
    // if the condition is unreachable, just return it
    if (curr->condition->type == Type::unreachable) {
      replaceCurrent(curr->condition);
      return;
    }
    // from here on, we can assume the condition executed

    // In trapsNeverHappen mode, a definitely-trapping arm can be assumed to not
    // happen. Such conditional code can be assumed to never be reached in this
    // mode.
    //
    // Ignore the case of an unreachable if, such as having both arms be
    // unreachable. In that case we'd need to fix up the IR to avoid changing
    // the type; leave that for DCE to simplify first. After checking that
    // curr->type != unreachable, we can assume that only one of the arms is
    // unreachable (at most).
    if (getPassOptions().trapsNeverHappen && curr->type != Type::unreachable) {
      auto optimizeArm = [&](Expression* arm, Expression* otherArm) {
        if (!arm->is<Unreachable>()) {
          return false;
        }
        Builder builder(*getModule());
        Expression* rep = builder.makeDrop(curr->condition);
        if (otherArm) {
          rep = builder.makeSequence(rep, otherArm);
        }
        replaceCurrent(rep);
        return true;
      };

      // As mentioned above, do not try to optimize both arms; leave that case
      // for DCE.
      if (optimizeArm(curr->ifTrue, curr->ifFalse) ||
          (curr->ifFalse && optimizeArm(curr->ifFalse, curr->ifTrue))) {
        return;
      }
    }

    if (curr->ifFalse) {
      if (curr->ifFalse->is<Nop>()) {
        curr->ifFalse = nullptr;
      } else if (curr->ifTrue->is<Nop>()) {
        curr->ifTrue = curr->ifFalse;
        curr->ifFalse = nullptr;
        curr->condition =
          Builder(*getModule()).makeUnary(EqZInt32, curr->condition);
      } else if (curr->ifTrue->is<Drop>() && curr->ifFalse->is<Drop>()) {
        // instead of dropping both sides, drop the if, if they are the same
        // type
        auto* left = curr->ifTrue->cast<Drop>()->value;
        auto* right = curr->ifFalse->cast<Drop>()->value;
        if (left->type == right->type) {
          curr->ifTrue = left;
          curr->ifFalse = right;
          curr->finalize();
          replaceCurrent(Builder(*getModule()).makeDrop(curr));
        }
      }
    } else {
      // This is an if without an else. If the body is empty, we do not need it.
      if (curr->ifTrue->is<Nop>()) {
        replaceCurrent(Builder(*getModule()).makeDrop(curr->condition));
      }
    }
  }